

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.cxx
# Opt level: O1

bool __thiscall
cmLegacyCommandWrapper::operator()
          (cmLegacyCommandWrapper *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *status)

{
  bool bVar1;
  unique_ptr<cmCommand,_std::default_delete<cmCommand>_> cmd;
  cmCommand *local_20;
  
  (**(code **)((long)((this->Command)._M_t.
                      super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
                      super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
                      super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl)->_vptr_cmCommand +
              0x18))(&local_20);
  local_20->Status = status;
  local_20->Makefile = status->Makefile;
  bVar1 = cmCommand::InvokeInitialPass(local_20,args,status);
  if (local_20 != (cmCommand *)0x0) {
    (*local_20->_vptr_cmCommand[1])();
  }
  return bVar1;
}

Assistant:

bool cmLegacyCommandWrapper::operator()(
  std::vector<cmListFileArgument> const& args, cmExecutionStatus& status) const
{
  auto cmd = this->Command->Clone();
  cmd->SetExecutionStatus(&status);
  return cmd->InvokeInitialPass(args, status);
}